

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O0

bool __thiscall
BamTools::ResolveTool::StatsFileReader::ParseOptionLine
          (StatsFileReader *this,string *line,ResolveSettings *settings)

{
  __type _Var1;
  _Ios_Openmode _Var2;
  size_type sVar3;
  reference __lhs;
  ostream *poVar4;
  long in_RDX;
  stringstream value;
  string *option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  size_type in_stack_fffffffffffffde8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdf0;
  ostream *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  stringstream local_1e0 [408];
  reference local_48;
  undefined4 local_3c;
  char in_stack_ffffffffffffffd7;
  string *in_stack_ffffffffffffffd8;
  bool local_1;
  
  Utilities::Split(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffc8);
  if (sVar3 == 2) {
    local_48 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1e0,(string *)__lhs,_Var2);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(_Var2,in_stack_fffffffffffffe08));
    if (_Var1) {
      std::istream::operator>>(local_1e0,(double *)(in_RDX + 0x90));
      *(undefined1 *)(in_RDX + 7) = 1;
      local_1 = true;
    }
    else {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(_Var2,in_stack_fffffffffffffe08));
      if (_Var1) {
        std::istream::operator>>(local_1e0,(bool *)(in_RDX + 8));
        local_1 = true;
      }
      else {
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(_Var2,in_stack_fffffffffffffe08));
        if (_Var1) {
          std::istream::operator>>(local_1e0,(ushort *)(in_RDX + 0x98));
          *(undefined1 *)(in_RDX + 9) = 1;
          local_1 = true;
        }
        else {
          _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT44(_Var2,in_stack_fffffffffffffe08));
          if (_Var1) {
            std::istream::operator>>(local_1e0,(double *)(in_RDX + 0xa0));
            *(undefined1 *)(in_RDX + 10) = 1;
            local_1 = true;
          }
          else {
            in_stack_fffffffffffffe00 =
                 std::operator<<((ostream *)&std::cerr,
                                 "bamtools resolve ERROR - unrecognized option: ");
            poVar4 = std::operator<<(in_stack_fffffffffffffe00,(string *)local_48);
            poVar4 = std::operator<<(poVar4," in stats file");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            local_1 = false;
          }
        }
      }
    }
    local_3c = 1;
    std::__cxx11::stringstream::~stringstream(local_1e0);
  }
  else {
    local_1 = false;
    local_3c = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffe00);
  return local_1;
}

Assistant:

bool ResolveTool::StatsFileReader::ParseOptionLine(const std::string& line,
                                                   ResolveTool::ResolveSettings* settings)
{
    // split line into option, value
    std::vector<std::string> fields = Utilities::Split(line, EQUAL_CHAR);
    if (fields.size() != NUM_OPTIONS_FIELDS) return false;
    const std::string& option = fields.at(0);
    std::stringstream value(fields.at(1));

    // -----------------------------------
    // handle option based on keyword

    // ConfidenceInterval
    if (option == OPTION_CONFIDENCEINTERVAL) {
        value >> settings->ConfidenceInterval;
        settings->HasConfidenceInterval = true;
        return true;
    }

    // ForceMarkReadGroups
    if (option == OPTION_FORCEMARKREADGROUPS) {
        value >> settings->HasForceMarkReadGroups;
        return true;
    }

    // MinimumMapQuality
    if (option == OPTION_MINIMUMMAPQUALITY) {
        value >> settings->MinimumMapQuality;
        settings->HasMinimumMapQuality = true;
        return true;
    }

    // UnusedModelThreshold
    if (option == OPTION_UNUSEDMODELTHRESHOLD) {
        value >> settings->UnusedModelThreshold;
        settings->HasUnusedModelThreshold = true;
        return true;
    }

    // otherwise unknown option
    std::cerr << "bamtools resolve ERROR - unrecognized option: " << option << " in stats file"
              << std::endl;
    return false;
}